

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

bool __thiscall
dtc::fdt::checking::anon_unknown_4::deleted_node_checker::check_node
          (deleted_node_checker *this,device_tree *param_1,node_ptr *n)

{
  bool bVar1;
  element_type *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  value_type *d;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_59;
  string local_58 [8];
  string errmsg;
  bool plural;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *deleted;
  node_ptr *n_local;
  device_tree *param_1_local;
  deleted_node_checker *this_local;
  
  this_00 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)n);
  this_01 = node::deleted_child_nodes_abi_cxx11_(this_00);
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_01);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_01);
    errmsg.field_2._M_local_buf[0xf] = 1 < sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"Attempts to delete ",&local_59);
    std::allocator<char>::~allocator(&local_59);
    pcVar4 = "node";
    if ((errmsg.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar4 = "nodes";
    }
    std::__cxx11::string::operator+=(local_58,pcVar4);
    std::__cxx11::string::operator+=(local_58," that ");
    pcVar4 = "was";
    if ((errmsg.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar4 = "were";
    }
    std::__cxx11::string::operator+=(local_58,pcVar4);
    std::__cxx11::string::operator+=(local_58," not added in merge: ");
    __end3 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    d = (value_type *)
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end3.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)&d);
      if (!bVar1) break;
      pvVar3 = std::__detail::
               _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               ::operator*(&__end3);
      std::__cxx11::string::operator+=(local_58,(string *)pvVar3);
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator++(&__end3);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    checker::report_error(&this->super_checker,pcVar4);
    this_local._7_1_ = false;
    std::__cxx11::string::~string(local_58);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool check_node(device_tree *, const node_ptr &n)
		{
			auto &deleted = n->deleted_child_nodes();
			if (deleted.empty())
			{
				return true;
			}
			bool plural = deleted.size() > 1;
			string errmsg("Attempts to delete ");
			errmsg += plural ? "nodes" : "node";
			errmsg += " that ";
			errmsg += plural ? "were" : "was";
			errmsg += " not added in merge: ";
			for (auto &d : deleted)
			{
				errmsg += d;
			}
			report_error(errmsg.c_str());
			return false;
		}